

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Create_irreg(int type,int ndim,int *dims,char *name,int *block,int *map)

{
  ulong uVar1;
  Integer *map_00;
  logical lVar2;
  int *piVar3;
  int iVar4;
  ulong ndim_00;
  Integer g_a;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  Integer local_b0 [8];
  long lStack_70;
  Integer local_68 [7];
  
  if (7 < ndim) {
    return 0;
  }
  if (0 < ndim) {
    ndim_00 = (ulong)(uint)ndim;
    uVar1 = ndim_00;
    do {
      (&lStack_70)[uVar1] = (long)*dims;
      dims = dims + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    uVar1 = ndim_00;
    piVar3 = block;
    if (0 < ndim) {
      do {
        local_b0[uVar1] = (long)*piVar3;
        uVar1 = uVar1 - 1;
        piVar3 = piVar3 + 1;
      } while (uVar1 != 0);
      goto LAB_00105971;
    }
  }
  ndim_00 = (ulong)ndim;
LAB_00105971:
  map_00 = copy_map(block,ndim,map);
  _ga_irreg_flag = 1;
  lVar2 = pnga_create_irreg((long)type,ndim_00,local_68,name,map_00,local_b0 + 1,local_b0);
  _ga_irreg_flag = 0;
  free(map_00);
  iVar4 = 0;
  if (lVar2 == 1) {
    iVar4 = (int)local_b0[0];
  }
  return iVar4;
}

Assistant:

int NGA_Create_irreg(int type,int ndim,int dims[],char *name,int block[],int map[])
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_irreg(type, (Integer)ndim, _ga_dims, name, _ga_map_capi,
            _ga_work, &g_a);
    _ga_irreg_flag = 0; /* unset it after creating the array */

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}